

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

GLenum Diligent::TypeToGLTexFormat(VALUE_TYPE ValType,Uint32 NumComponents,Bool bIsNormalized)

{
  Char *pCVar1;
  undefined1 local_248 [8];
  string msg_16;
  string msg_15;
  string msg_14;
  string msg_13;
  string msg_12;
  string msg_11;
  string msg_10;
  string msg_9;
  string msg_8;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Bool bIsNormalized_local;
  Uint32 NumComponents_local;
  VALUE_TYPE ValType_local;
  
  msg.field_2._M_local_buf[0xb] = bIsNormalized;
  msg.field_2._12_4_ = NumComponents;
  switch(ValType) {
  case VT_INT8:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        NumComponents_local = 0x8f94;
      }
      else if (NumComponents == 2) {
        NumComponents_local = 0x8f95;
      }
      else if (NumComponents == 4) {
        NumComponents_local = 0x8f97;
      }
      else {
        FormatString<char[33]>
                  ((string *)((long)&msg_13.field_2 + 8),
                   (char (*) [33])"Unsupported number of components");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"TypeToGLTexFormat",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                   ,0x22a);
        std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
        NumComponents_local = 0;
      }
    }
    else if (NumComponents == 1) {
      NumComponents_local = 0x8231;
    }
    else if (NumComponents == 2) {
      NumComponents_local = 0x8237;
    }
    else if (NumComponents == 4) {
      NumComponents_local = 0x8d8e;
    }
    else {
      FormatString<char[33]>
                ((string *)((long)&msg_14.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x234);
      std::__cxx11::string::~string((string *)(msg_14.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_INT16:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        NumComponents_local = 0x8f98;
      }
      else if (NumComponents == 2) {
        NumComponents_local = 0x8f99;
      }
      else if (NumComponents == 4) {
        NumComponents_local = 0x8f9b;
      }
      else {
        FormatString<char[33]>
                  ((string *)((long)&msg_9.field_2 + 8),
                   (char (*) [33])"Unsupported number of components");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"TypeToGLTexFormat",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                   ,0x1fa);
        std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
        NumComponents_local = 0;
      }
    }
    else if (NumComponents == 1) {
      NumComponents_local = 0x8233;
    }
    else if (NumComponents == 2) {
      NumComponents_local = 0x8239;
    }
    else if (NumComponents == 4) {
      NumComponents_local = 0x8d88;
    }
    else {
      FormatString<char[33]>
                ((string *)((long)&msg_10.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x204);
      std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_INT32:
    if (bIsNormalized) {
      FormatString<char[62]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [62])"32-bit UNORM formats are not supported. Use R32_FLOAT instead");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1d9);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    switch(msg.field_2._12_4_) {
    case 1:
      NumComponents_local = 0x8235;
      break;
    case 2:
      NumComponents_local = 0x823b;
      break;
    case 3:
      NumComponents_local = 0x8d83;
      break;
    case 4:
      NumComponents_local = 0x8d82;
      break;
    default:
      FormatString<char[33]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1e0);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_UINT8:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        NumComponents_local = 0x8229;
      }
      else if (NumComponents == 2) {
        NumComponents_local = 0x822b;
      }
      else if (NumComponents == 4) {
        NumComponents_local = 0x8058;
      }
      else {
        FormatString<char[33]>
                  ((string *)((long)&msg_15.field_2 + 8),
                   (char (*) [33])"Unsupported number of components");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"TypeToGLTexFormat",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                   ,0x242);
        std::__cxx11::string::~string((string *)(msg_15.field_2._M_local_buf + 8));
        NumComponents_local = 0;
      }
    }
    else if (NumComponents == 1) {
      NumComponents_local = 0x8232;
    }
    else if (NumComponents == 2) {
      NumComponents_local = 0x8238;
    }
    else if (NumComponents == 4) {
      NumComponents_local = 0x8d7c;
    }
    else {
      FormatString<char[33]>
                ((string *)((long)&msg_16.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x24c);
      std::__cxx11::string::~string((string *)(msg_16.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_UINT16:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        NumComponents_local = 0x822a;
      }
      else if (NumComponents == 2) {
        NumComponents_local = 0x822c;
      }
      else if (NumComponents == 4) {
        NumComponents_local = 0x805b;
      }
      else {
        FormatString<char[33]>
                  ((string *)((long)&msg_11.field_2 + 8),
                   (char (*) [33])"Unsupported number of components");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"TypeToGLTexFormat",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                   ,0x212);
        std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
        NumComponents_local = 0;
      }
    }
    else if (NumComponents == 1) {
      NumComponents_local = 0x8234;
    }
    else if (NumComponents == 2) {
      NumComponents_local = 0x823a;
    }
    else if (NumComponents == 4) {
      NumComponents_local = 0x8d76;
    }
    else {
      FormatString<char[33]>
                ((string *)((long)&msg_12.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x21c);
      std::__cxx11::string::~string((string *)(msg_12.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_UINT32:
    if (bIsNormalized) {
      FormatString<char[62]>
                ((string *)((long)&msg_7.field_2 + 8),
                 (char (*) [62])"32-bit UNORM formats are not supported. Use R32_FLOAT instead");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1e6);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    switch(msg.field_2._12_4_) {
    case 1:
      NumComponents_local = 0x8236;
      break;
    case 2:
      NumComponents_local = 0x823c;
      break;
    case 3:
      NumComponents_local = 0x8d71;
      break;
    case 4:
      NumComponents_local = 0x8d70;
      break;
    default:
      FormatString<char[33]>
                ((string *)((long)&msg_8.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1ed);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_FLOAT16:
    if (bIsNormalized) {
      FormatString<char[44]>
                ((string *)local_38,(char (*) [44])"Floating point formats cannot be normalized");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1c0);
      std::__cxx11::string::~string((string *)local_38);
    }
    if (msg.field_2._12_4_ == 1) {
      NumComponents_local = 0x822d;
    }
    else if (msg.field_2._12_4_ == 2) {
      NumComponents_local = 0x822f;
    }
    else if (msg.field_2._12_4_ == 4) {
      NumComponents_local = 0x881a;
    }
    else {
      FormatString<char[33]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1c6);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  case VT_FLOAT32:
    if (bIsNormalized) {
      FormatString<char[44]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [44])"Floating point formats cannot be normalized");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1cc);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    switch(msg.field_2._12_4_) {
    case 1:
      NumComponents_local = 0x822e;
      break;
    case 2:
      NumComponents_local = 0x8230;
      break;
    case 3:
      NumComponents_local = 0x8815;
      break;
    case 4:
      NumComponents_local = 0x8814;
      break;
    default:
      FormatString<char[33]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [33])"Unsupported number of components");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1d3);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      NumComponents_local = 0;
    }
    break;
  default:
    FormatString<char[19]>((string *)local_248,(char (*) [19])"Unsupported format");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"TypeToGLTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x251);
    std::__cxx11::string::~string((string *)local_248);
    NumComponents_local = 0;
  }
  return NumComponents_local;
}

Assistant:

GLenum TypeToGLTexFormat(VALUE_TYPE ValType, Uint32 NumComponents, Bool bIsNormalized)
{
    switch (ValType)
    {
        case VT_FLOAT16:
        {
            VERIFY(!bIsNormalized, "Floating point formats cannot be normalized");
            switch (NumComponents)
            {
                case 1: return GL_R16F;
                case 2: return GL_RG16F;
                case 4: return GL_RGBA16F;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_FLOAT32:
        {
            VERIFY(!bIsNormalized, "Floating point formats cannot be normalized");
            switch (NumComponents)
            {
                case 1: return GL_R32F;
                case 2: return GL_RG32F;
                case 3: return GL_RGB32F;
                case 4: return GL_RGBA32F;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_INT32:
        {
            VERIFY(!bIsNormalized, "32-bit UNORM formats are not supported. Use R32_FLOAT instead");
            switch (NumComponents)
            {
                case 1: return GL_R32I;
                case 2: return GL_RG32I;
                case 3: return GL_RGB32I;
                case 4: return GL_RGBA32I;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_UINT32:
        {
            VERIFY(!bIsNormalized, "32-bit UNORM formats are not supported. Use R32_FLOAT instead");
            switch (NumComponents)
            {
                case 1: return GL_R32UI;
                case 2: return GL_RG32UI;
                case 3: return GL_RGB32UI;
                case 4: return GL_RGBA32UI;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_INT16:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16_SNORM;
                    case 2: return GL_RG16_SNORM;
                    case 4: return GL_RGBA16_SNORM;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16I;
                    case 2: return GL_RG16I;
                    case 4: return GL_RGBA16I;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        case VT_UINT16:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16;
                    case 2: return GL_RG16;
                    case 4: return GL_RGBA16;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16UI;
                    case 2: return GL_RG16UI;
                    case 4: return GL_RGBA16UI;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        case VT_INT8:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8_SNORM;
                    case 2: return GL_RG8_SNORM;
                    case 4: return GL_RGBA8_SNORM;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8I;
                    case 2: return GL_RG8I;
                    case 4: return GL_RGBA8I;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        case VT_UINT8:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8;
                    case 2: return GL_RG8;
                    case 4: return GL_RGBA8;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8UI;
                    case 2: return GL_RG8UI;
                    case 4: return GL_RGBA8UI;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        default: UNEXPECTED("Unsupported format"); return 0;
    }
}